

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrSenseDataProviderCreateInfoSpatialMeshBD *value,string *prefix,string *type_string,
               bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  XrStructureType XVar3;
  XrSpatialMeshLodBD XVar4;
  pointer pcVar5;
  PFN_xrStructureTypeToString p_Var6;
  void *value_00;
  XrStructureType __val;
  XrSpatialMeshLodBD __val_00;
  uint uVar7;
  char cVar8;
  bool bVar9;
  char *pcVar10;
  XrInstance pXVar11;
  invalid_argument *this;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  XrSenseDataProviderCreateInfoSpatialMeshBD *pXVar16;
  char cVar17;
  uint uVar18;
  string next_prefix;
  string lod_prefix;
  string type_prefix;
  string configflags_prefix;
  string __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  XrSenseDataProviderCreateInfoSpatialMeshBD *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_b8._M_dataplus._M_p = (pointer)value;
  local_98 = value;
  std::__cxx11::string::_M_construct((ulong)&local_128,'\x12');
  *local_128._M_dataplus._M_p = '0';
  local_128._M_dataplus._M_p[1] = 'x';
  pcVar10 = local_128._M_dataplus._M_p + (local_128._M_string_length - 1);
  lVar13 = 0;
  do {
    bVar2 = *(byte *)((long)&local_b8._M_dataplus._M_p + lVar13);
    *pcVar10 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
    pcVar10[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
    lVar13 = lVar13 + 1;
    pcVar10 = pcVar10 + -2;
  } while (lVar13 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar5,pcVar5 + prefix->_M_string_length);
  pXVar16 = local_98;
  std::__cxx11::string::append((char *)&local_b8);
  local_e0 = (vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents;
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar3 = pXVar16->type;
    __val = -XVar3;
    if (0 < (int)XVar3) {
      __val = XVar3;
    }
    uVar18 = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar15 = (ulong)__val;
      uVar7 = 4;
      do {
        uVar18 = uVar7;
        uVar12 = (uint)uVar15;
        if (uVar12 < 100) {
          uVar18 = uVar18 - 2;
          goto LAB_0020046b;
        }
        if (uVar12 < 1000) {
          uVar18 = uVar18 - 1;
          goto LAB_0020046b;
        }
        if (uVar12 < 10000) goto LAB_0020046b;
        uVar15 = uVar15 / 10000;
        uVar7 = uVar18 + 4;
      } while (99999 < uVar12);
      uVar18 = uVar18 + 1;
    }
LAB_0020046b:
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_128,(char)uVar18 - (char)((int)XVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_128._M_dataplus._M_p + (XVar3 >> 0x1f),uVar18,__val);
    contents = (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_e0;
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              (local_e0,(char (*) [16])"XrStructureType",&local_b8,&local_128);
    pXVar16 = local_98;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_f8 = 0;
    uStack_f0 = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_128.field_2._M_allocated_capacity = 0;
    local_128.field_2._8_8_ = 0;
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    p_Var6 = gen_dispatch_table->StructureTypeToString;
    pXVar11 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var6)(pXVar11,pXVar16->type,(char *)&local_128);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_b8,(char (*) [64])&local_128);
  }
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_128);
  value_00 = pXVar16->next;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_128._M_dataplus._M_p,
             local_128._M_dataplus._M_p + local_128._M_string_length);
  bVar9 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_50,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (!bVar9) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Invalid Operation");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_90);
  uVar15 = pXVar16->configFlags;
  cVar17 = '\x01';
  if (9 < uVar15) {
    uVar14 = uVar15;
    cVar8 = '\x04';
    do {
      cVar17 = cVar8;
      if (uVar14 < 100) {
        cVar17 = cVar17 + -2;
        goto LAB_002005f8;
      }
      if (uVar14 < 1000) {
        cVar17 = cVar17 + -1;
        goto LAB_002005f8;
      }
      if (uVar14 < 10000) goto LAB_002005f8;
      bVar9 = 99999 < uVar14;
      uVar14 = uVar14 / 10000;
      cVar8 = cVar17 + '\x04';
    } while (bVar9);
    cVar17 = cVar17 + '\x01';
  }
LAB_002005f8:
  paVar1 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_d8,cVar17);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_d8._M_dataplus._M_p,(uint)local_d8._M_string_length,uVar15);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[27],std::__cxx11::string&,std::__cxx11::string>
            (local_e0,(char (*) [27])"XrSpatialMeshConfigFlagsBD",&local_90,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = (prefix->_M_dataplus)._M_p;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_d8);
  XVar4 = pXVar16->lod;
  __val_00 = -XVar4;
  if (0 < (int)XVar4) {
    __val_00 = XVar4;
  }
  uVar18 = 1;
  if (9 < __val_00) {
    uVar15 = (ulong)__val_00;
    uVar7 = 4;
    do {
      uVar18 = uVar7;
      uVar12 = (uint)uVar15;
      if (uVar12 < 100) {
        uVar18 = uVar18 - 2;
        goto LAB_002006df;
      }
      if (uVar12 < 1000) {
        uVar18 = uVar18 - 1;
        goto LAB_002006df;
      }
      if (uVar12 < 10000) goto LAB_002006df;
      uVar15 = uVar15 / 10000;
      uVar7 = uVar18 + 4;
    } while (99999 < uVar12);
    uVar18 = uVar18 + 1;
  }
LAB_002006df:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar18 - (char)((int)XVar4 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70._M_dataplus._M_p + (XVar4 >> 0x1f),uVar18,__val_00);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[19],std::__cxx11::string&,std::__cxx11::string>
            (local_e0,(char (*) [19])"XrSpatialMeshLodBD",&local_d8,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrSenseDataProviderCreateInfoSpatialMeshBD* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string configflags_prefix = prefix;
        configflags_prefix += "configFlags";
        contents.emplace_back("XrSpatialMeshConfigFlagsBD", configflags_prefix, std::to_string(value->configFlags));
        std::string lod_prefix = prefix;
        lod_prefix += "lod";
        contents.emplace_back("XrSpatialMeshLodBD", lod_prefix, std::to_string(value->lod));
        return true;
    } catch(...) {
    }
    return false;
}